

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O3

Vec_Ptr_t * Abc_NtkAssignIDs2(Abc_Ntk_t *pNtk)

{
  void *pvVar1;
  long lVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  
  Abc_NtkCleanCopy(pNtk);
  pVVar3 = pNtk->vCis;
  if (0 < pVVar3->nSize) {
    lVar2 = 0;
    do {
      *(int *)((long)pVVar3->pArray[lVar2] + 0x40) = (int)lVar2;
      lVar2 = lVar2 + 1;
      pVVar3 = pNtk->vCis;
    } while (lVar2 < pVVar3->nSize);
  }
  uVar8 = pNtk->nObjCounts[7];
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  uVar9 = 8;
  if (6 < uVar8 - 1) {
    uVar9 = (ulong)uVar8;
  }
  pVVar3->nSize = 0;
  iVar7 = (int)uVar9;
  pVVar3->nCap = iVar7;
  uVar10 = 0;
  if (iVar7 == 0) {
    ppvVar4 = (void **)0x0;
  }
  else {
    ppvVar4 = (void **)malloc((long)iVar7 << 3);
  }
  pVVar3->pArray = ppvVar4;
  pVVar5 = pNtk->vObjs;
  if (0 < pVVar5->nSize) {
    uVar10 = 0;
    lVar2 = 0;
    do {
      pvVar1 = pVVar5->pArray[lVar2];
      if ((pvVar1 != (void *)0x0) && ((*(uint *)((long)pvVar1 + 0x14) & 0xf) == 7)) {
        *(uint *)((long)pvVar1 + 0x40) = pNtk->vCis->nSize + uVar10;
        uVar8 = (uint)uVar9;
        if (uVar10 == uVar8) {
          if ((int)uVar8 < 0x10) {
            if (pVVar3->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(0x80);
            }
            else {
              ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
            }
            pVVar3->pArray = ppvVar4;
            pVVar3->nCap = 0x10;
            uVar9 = 0x10;
          }
          else {
            uVar9 = (ulong)(uVar8 * 2);
            if (pVVar3->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(uVar9 * 8);
            }
            else {
              ppvVar4 = (void **)realloc(pVVar3->pArray,uVar9 * 8);
            }
            pVVar3->pArray = ppvVar4;
            pVVar3->nCap = uVar8 * 2;
          }
        }
        else {
          ppvVar4 = pVVar3->pArray;
        }
        lVar6 = (long)(int)uVar10;
        uVar10 = uVar10 + 1;
        pVVar3->nSize = uVar10;
        ppvVar4[lVar6] = pvVar1;
        pVVar5 = pNtk->vObjs;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < pVVar5->nSize);
    uVar8 = pNtk->nObjCounts[7];
  }
  if (uVar10 == uVar8) {
    pVVar5 = pNtk->vCos;
    if (0 < pVVar5->nSize) {
      lVar2 = 0;
      do {
        *(uint *)((long)pVVar5->pArray[lVar2] + 0x40) = uVar8 + (int)lVar2 + pNtk->vCis->nSize;
        lVar2 = lVar2 + 1;
        pVVar5 = pNtk->vCos;
      } while (lVar2 < pVVar5->nSize);
    }
    return pVVar3;
  }
  __assert_fail("Vec_PtrSize(vNodes) == Abc_NtkNodeNum(pNtk)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMfs.c"
                ,0x4d,"Vec_Ptr_t *Abc_NtkAssignIDs2(Abc_Ntk_t *)");
}

Assistant:

Vec_Ptr_t * Abc_NtkAssignIDs2( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj;
    int i;
    Abc_NtkCleanCopy( pNtk );
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->iTemp = i;
    vNodes = Vec_PtrAlloc( Abc_NtkNodeNum(pNtk) );
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        pObj->iTemp = Abc_NtkCiNum(pNtk) + Vec_PtrSize(vNodes);
        Vec_PtrPush( vNodes, pObj );
    }
    assert( Vec_PtrSize(vNodes) == Abc_NtkNodeNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pObj, i )
        pObj->iTemp = Abc_NtkCiNum(pNtk) + Vec_PtrSize(vNodes) + i;
    return vNodes;
}